

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.h
# Opt level: O0

int MyGame_Example_TestSimpleTableWithEnum_verify_table(flatcc_table_verifier_descriptor_t *td)

{
  int ret;
  flatcc_table_verifier_descriptor_t *td_local;
  
  td_local._4_4_ = flatcc_verify_field(td,0,1,1);
  if ((((td_local._4_4_ == 0) &&
       (td_local._4_4_ = flatcc_verify_field(td,1,1,1), td_local._4_4_ == 0)) &&
      (td_local._4_4_ = flatcc_verify_field(td,2,1,1), td_local._4_4_ == 0)) &&
     (td_local._4_4_ = flatcc_verify_field(td,3,1,1), td_local._4_4_ == 0)) {
    td_local._4_4_ = 0;
  }
  return td_local._4_4_;
}

Assistant:

static int MyGame_Example_TestSimpleTableWithEnum_verify_table(flatcc_table_verifier_descriptor_t *td)
{
    int ret;
    if ((ret = flatcc_verify_field(td, 0, 1, 1) /* color */)) return ret;
    if ((ret = flatcc_verify_field(td, 1, 1, 1) /* color2 */)) return ret;
    if ((ret = flatcc_verify_field(td, 2, 1, 1) /* uc */)) return ret;
    if ((ret = flatcc_verify_field(td, 3, 1, 1) /* uc2 */)) return ret;
    return flatcc_verify_ok;
}